

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O1

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  long *plVar11;
  Bac_Ntk_t *p;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 local_40;
  
  puVar2 = (undefined8 *)pAbc->pAbcBac;
  local_40 = 0;
  Extra_UtilGetoptReset();
  bVar3 = false;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"Mvh"), iVar5 = globalUtilOptind, iVar4 == 0x76) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar4 == -1) {
      if (puVar2 == (undefined8 *)0x0) {
        Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
        return 0;
      }
      iVar5 = *(int *)(puVar2 + 4);
      uVar13 = 0;
      if (((long)iVar5 < 1) || (*(int *)((long)puVar2 + 0x24) < iVar5)) {
        lVar8 = 0;
      }
      else {
        lVar8 = (long)iVar5 * 0xd0 + puVar2[5];
      }
      printf("%-12s : ",*puVar2);
      printf("pi =%5d  ",(ulong)*(uint *)(lVar8 + 0x24));
      printf("po =%5d  ",(ulong)*(uint *)(lVar8 + 0x34));
      iVar5 = Abc_NamObjNumMax((Abc_Nam_t *)puVar2[3]);
      printf("pri =%4d  ",(ulong)(uint)(iVar5 - *(int *)((long)puVar2 + 0x24)));
      printf("mod =%6d  ",(ulong)*(uint *)((long)puVar2 + 0x24));
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        uVar13 = 0;
        lVar8 = 1;
        do {
          iVar5 = *(int *)(puVar2[5] + 0x54 + lVar8 * 0xd0);
          iVar4 = 0;
          if (0 < (long)iVar5) {
            lVar12 = 0;
            iVar4 = 0;
            do {
              bVar1 = *(byte *)(*(long *)(lVar8 * 0xd0 + puVar2[5] + 0x58) + lVar12);
              if ((char)bVar1 < '\0') goto LAB_0030cf80;
              iVar4 = iVar4 + (uint)(bVar1 < 10);
              lVar12 = lVar12 + 1;
            } while (iVar5 != lVar12);
          }
          uVar13 = (uVar13 + iVar5) - iVar4;
          lVar8 = lVar8 + 1;
        } while (lVar8 != (ulong)*(uint *)((long)puVar2 + 0x24) + 1);
      }
      uVar10 = 0;
      printf("box =%7d  ",(ulong)uVar13);
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 + *(int *)(puVar2[5] + 0x124 + lVar8);
          lVar8 = lVar8 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar8 != 0);
      }
      printf("obj =%7d  ",(ulong)uVar10);
      if ((char *)*puVar2 == (char *)0x0) {
        iVar5 = 0x530;
      }
      else {
        sVar7 = strlen((char *)*puVar2);
        iVar5 = (int)sVar7 + 0x530;
      }
      if ((char *)puVar2[1] != (char *)0x0) {
        sVar7 = strlen((char *)puVar2[1]);
        iVar5 = iVar5 + (int)sVar7;
      }
      iVar4 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[2]);
      iVar6 = Abc_NamMemUsed((Abc_Nam_t *)puVar2[3]);
      iVar6 = iVar6 + iVar4 + iVar5;
      if (0 < (int)*(uint *)((long)puVar2 + 0x24)) {
        lVar8 = puVar2[5];
        lVar12 = 0;
        do {
          iVar6 = (int)((double)*(int *)(lVar8 + 0x170 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x160 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x150 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x140 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x130 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x110 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0x100 + lVar12) * 4.0 + 16.0) +
                  (int)((double)*(int *)(lVar8 + 0xf0 + lVar12) * 4.0 + 16.0) + iVar6 +
                  *(int *)(lVar8 + 0x120 + lVar12) + 0xe0;
          lVar12 = lVar12 + 0xd0;
        } while ((ulong)*(uint *)((long)puVar2 + 0x24) * 0xd0 - lVar12 != 0);
      }
      printf("mem =%6.3f MB",(double)iVar6 * 9.5367431640625e-07);
      putchar(10);
      uVar13 = *(uint *)((long)puVar2 + 0x24);
      if (0 < (int)uVar13) {
        lVar8 = puVar2[5];
        lVar12 = 0;
        do {
          *(undefined4 *)(lVar8 + 0xe8 + lVar12) = 0xffffffff;
          lVar12 = lVar12 + 0xd0;
        } while ((ulong)uVar13 * 0xd0 - lVar12 != 0);
      }
      uVar10 = *(uint *)(puVar2 + 4);
      if ((int)uVar13 < (int)uVar10 || (int)uVar10 < 1) {
        p = (Bac_Ntk_t *)0x0;
      }
      else {
        p = (Bac_Ntk_t *)((ulong)uVar10 * 0xd0 + puVar2[5]);
      }
      Bac_ManBoxNum_rec(p);
      if (*(int *)((long)puVar2 + 0x24) < 1) {
        return 0;
      }
      uVar14 = 1;
      do {
        if (uVar14 == (int)local_40 + 1) {
          return 0;
        }
        plVar11 = (long *)(uVar14 * 0xd0 + puVar2[5]);
        iVar4 = 0;
        printf("Module %5d : ",uVar14 & 0xffffffff);
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar11 + 0x24));
        printf("pi =%5d  ",(ulong)*(uint *)((long)plVar11 + 0x34));
        iVar5 = *(int *)((long)plVar11 + 0x54);
        if (0 < (long)iVar5) {
          lVar8 = 0;
          iVar4 = 0;
          do {
            if ((char)*(byte *)(plVar11[0xb] + lVar8) < '\0') {
LAB_0030cf80:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10c,"int Abc_Lit2Var(int)");
            }
            iVar4 = iVar4 + (uint)(*(byte *)(plVar11[0xb] + lVar8) < 10);
            lVar8 = lVar8 + 1;
          } while (iVar5 != lVar8);
        }
        printf("box =%6d  ",(ulong)(uint)(iVar5 - iVar4));
        printf("clp =%7d  ",(ulong)*(uint *)(plVar11 + 3));
        printf("obj =%7d  ",(ulong)*(uint *)((long)plVar11 + 0x54));
        pcVar9 = Abc_NamStr(*(Abc_Nam_t **)(*plVar11 + 0x10),(int)plVar11[1]);
        printf("%s ",pcVar9);
        iVar5 = (int)plVar11[2];
        if ((0 < (long)iVar5) && (iVar5 <= *(int *)(*plVar11 + 0x24))) {
          lVar8 = *(long *)(*plVar11 + 0x28);
          lVar12 = (long)iVar5 * 0xd0;
          pcVar9 = Abc_NamStr(*(Abc_Nam_t **)(*(long *)(lVar8 + lVar12) + 0x10),
                              *(int *)(lVar8 + 8 + lVar12));
          printf("-> %s",pcVar9);
        }
        putchar(10);
        bVar3 = (long)*(int *)((long)puVar2 + 0x24) <= (long)uVar14;
        uVar14 = uVar14 + 1;
        if (bVar3) {
          return 0;
        }
      } while( true );
    }
    if (iVar4 != 0x4d) goto LAB_0030ceef;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_0030ceef;
    }
    iVar4 = atoi(argv[globalUtilOptind]);
    local_40 = CONCAT44(extraout_var,iVar4);
    globalUtilOptind = iVar5 + 1;
    if (iVar4 < 0) {
LAB_0030ceef:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",local_40);
      pcVar9 = "yes";
      if (!bVar3) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar9);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}